

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

ssize_t __thiscall vox::nGRP::write(nGRP *this,int __fd,void *__buf,size_t __n)

{
  int *__ptr;
  size_t sVar1;
  FILE *__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined8 local_30;
  size_t childSize;
  size_t contentSize;
  FILE *pFStack_18;
  int32_t id;
  FILE *fp_local;
  nGRP *this_local;
  
  pFStack_18 = (FILE *)CONCAT44(in_register_00000034,__fd);
  fp_local = (FILE *)this;
  contentSize._4_4_ = GetMVID('n','G','R','P');
  fwrite((void *)((long)&contentSize + 4),4,1,pFStack_18);
  childSize = getSize(this);
  fwrite(&childSize,4,1,pFStack_18);
  local_30 = 0;
  fwrite(&local_30,4,1,pFStack_18);
  __n_00 = pFStack_18;
  fwrite(this,4,1,pFStack_18);
  DICT::write(&this->nodeAttribs,(int)pFStack_18,__buf_00,(size_t)__n_00);
  fwrite(&this->nodeChildrenNodes,4,1,pFStack_18);
  __ptr = std::vector<int,_std::allocator<int>_>::data(&this->childNodes);
  sVar1 = fwrite(__ptr,4,(long)this->nodeChildrenNodes,pFStack_18);
  return sVar1;
}

Assistant:

void nGRP::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'G', 'R', 'P');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&nodeChildrenNodes, sizeof(int32_t), 1, fp);
    fwrite(childNodes.data(), sizeof(int32_t), nodeChildrenNodes, fp);
}